

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

void __thiscall GlobalSimpleStringMemoryAccountant::start(GlobalSimpleStringMemoryAccountant *this)

{
  MemoryAccountant *accountant;
  AccountingTestMemoryAllocator *this_00;
  TestMemoryAllocator *origAllocator;
  GlobalSimpleStringMemoryAccountant *this_local;
  
  if (this->allocator_ == (AccountingTestMemoryAllocator *)0x0) {
    this_00 = (AccountingTestMemoryAllocator *)
              operator_new(0x40,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/SimpleString.cpp"
                           ,0x4f);
    accountant = this->accountant_;
    origAllocator = SimpleString::getStringAllocator();
    AccountingTestMemoryAllocator::AccountingTestMemoryAllocator(this_00,accountant,origAllocator);
    this->allocator_ = this_00;
    SimpleString::setStringAllocator(&this->allocator_->super_TestMemoryAllocator);
  }
  return;
}

Assistant:

void GlobalSimpleStringMemoryAccountant::start()
{
    if (allocator_ != NULLPTR)
      return;

    allocator_ = new AccountingTestMemoryAllocator(*accountant_, SimpleString::getStringAllocator());

    SimpleString::setStringAllocator(allocator_);
}